

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<FileHeader>::reallocateAndGrow
          (QArrayDataPointer<FileHeader> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<FileHeader> *old)

{
  long lVar1;
  bool bVar2;
  FileHeader *pFVar3;
  QGenericArrayOps<FileHeader> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<FileHeader> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<FileHeader> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  FileHeader *in_stack_ffffffffffffff70;
  FileHeader *in_stack_ffffffffffffff78;
  QGenericArrayOps<FileHeader> *in_stack_ffffffffffffff80;
  QArrayDataPointer<FileHeader> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<FileHeader> *)in_stack_ffffffffffffff70), bVar2)) ||
     (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<FileHeader> *)&DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (pFVar3 = data((QArrayDataPointer<FileHeader> *)&stack0xffffffffffffffe0),
       pFVar3 == (FileHeader *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_003248ea;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<FileHeader> *)in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<FileHeader> *)
                  operator->((QArrayDataPointer<FileHeader> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<FileHeader> *)0x3247f7);
        begin((QArrayDataPointer<FileHeader> *)0x324806);
        QtPrivate::QGenericArrayOps<FileHeader>::copyAppend
                  (this_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (FileHeader *)operator->((QArrayDataPointer<FileHeader> *)&stack0xffffffffffffffe0);
        pFVar3 = begin((QArrayDataPointer<FileHeader> *)0x324841);
        begin((QArrayDataPointer<FileHeader> *)0x324850);
        QtPrivate::QGenericArrayOps<FileHeader>::moveAppend
                  (in_stack_ffffffffffffff80,pFVar3,in_stack_ffffffffffffff70);
      }
    }
    swap((QArrayDataPointer<FileHeader> *)in_stack_ffffffffffffff70,
         (QArrayDataPointer<FileHeader> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<FileHeader> *)in_stack_ffffffffffffff70,
           (QArrayDataPointer<FileHeader> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer((QArrayDataPointer<FileHeader> *)in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity((QArrayDataPointer<FileHeader> *)in_stack_ffffffffffffff70);
    freeSpaceAtEnd((QArrayDataPointer<FileHeader> *)in_stack_ffffffffffffff78);
    QtPrivate::QMovableArrayOps<FileHeader>::reallocate
              ((QMovableArrayOps<FileHeader> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_003248ea:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }